

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.h
# Opt level: O3

Field<int> * __thiscall ki::dml::Record::add_field<int>(Record *this,string *name,bool transferable)

{
  pointer pcVar1;
  Field<int> *pFVar2;
  bool bVar3;
  mapped_type *ppFVar4;
  size_t sVar5;
  Field<int> *this_00;
  string local_68;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  bVar3 = has_field(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar3) {
    ppFVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
              ::at(&this->m_field_map,name);
    pFVar2 = (Field<int> *)*ppFVar4;
    sVar5 = std::type_info::hash_code((type_info *)&int::typeinfo);
    if (sVar5 == (pFVar2->super_FieldBase).m_type_hash) {
      this_00 = (Field<int> *)0x0;
      if ((pFVar2->super_FieldBase).super_Serializable._vptr_Serializable ==
          (_func_int **)&PTR_write_to_0018bd50) {
        this_00 = pFVar2;
      }
    }
    else {
      this_00 = (Field<int> *)0x0;
    }
  }
  else {
    this_00 = (Field<int> *)operator_new(0x40);
    pcVar1 = (name->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
    Field<int>::Field(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    (this_00->super_FieldBase).m_transferable = transferable;
    add_field(this,(FieldBase *)this_00);
  }
  return this_00;
}

Assistant:

Field<ValueT> *add_field(std::string name, bool transferable = true)
		{
			// Does this field already exist?
			if (has_field(name))
			{
				// Return nullptr if the type is not the same
				auto *field = m_field_map.at(name);
				if (!field->is_type<ValueT>())
					return nullptr;
				return dynamic_cast<Field<ValueT> *>(field);
			}

			// Create the field
			auto *field = new Field<ValueT>(name);
			field->m_transferable = transferable;
			add_field(field);
			return field;
		}